

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::finishGroup(MemberInfo *this)

{
  uint **ppuVar1;
  uint64_t uVar2;
  Reader *pRVar3;
  Reader *dc;
  Builder local_90;
  uint64_t local_68;
  uint64_t groupId;
  Fault local_48;
  uint *local_40;
  uint *_kj_result;
  Builder structNode;
  MemberInfo *this_local;
  
  structNode._builder._32_8_ = this;
  if ((this->field_21).fieldScope != (StructOrGroup *)0x0) {
    StructLayout::Union::addDiscriminant((this->field_21).unionScope);
    capnp::schema::Node::Builder::getStruct((Builder *)&_kj_result,&this->node);
    capnp::schema::Node::Struct::Builder::setDiscriminantCount
              ((Builder *)&_kj_result,(uint16_t)this->unionDiscriminantCount);
    local_40 = kj::_::readMaybe<unsigned_int>(&((this->field_21).unionScope)->discriminantOffset);
    if (local_40 == (uint *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x79c,FAILED,"unionScope->discriminantOffset != nullptr","");
      kj::_::Debug::Fault::fatal(&local_48);
    }
    ppuVar1 = kj::mv<unsigned_int*>(&local_40);
    groupId = (uint64_t)*ppuVar1;
    capnp::schema::Node::Struct::Builder::setDiscriminantOffset
              ((Builder *)&_kj_result,*(uint32_t *)groupId);
  }
  if (this->parent != (MemberInfo *)0x0) {
    uVar2 = capnp::schema::Node::Builder::getId(&this->parent->node);
    local_68 = generateGroupId(uVar2,(uint16_t)this->index);
    capnp::schema::Node::Builder::setId(&this->node,local_68);
    uVar2 = capnp::schema::Node::Builder::getId(&this->parent->node);
    capnp::schema::Node::Builder::setScopeId(&this->node,uVar2);
    getSchema((Builder *)&dc,this);
    capnp::schema::Field::Builder::initGroup(&local_90,(Builder *)&dc);
    capnp::schema::Field::Group::Builder::setTypeId(&local_90,local_68);
    capnp::schema::Node::SourceInfo::Builder::setId(&this->sourceInfo,local_68);
    pRVar3 = kj::_::readMaybe<capnp::Text::Reader>(&this->docComment);
    if (pRVar3 != (Reader *)0x0) {
      capnp::schema::Node::SourceInfo::Builder::setDocComment
                (&this->sourceInfo,(Reader)(pRVar3->super_StringPtr).content);
    }
  }
  return;
}

Assistant:

void finishGroup() {
      if (unionScope != nullptr) {
        unionScope->addDiscriminant();  // if it hasn't happened already
        auto structNode = node.getStruct();
        structNode.setDiscriminantCount(unionDiscriminantCount);
        structNode.setDiscriminantOffset(KJ_ASSERT_NONNULL(unionScope->discriminantOffset));
      }

      if (parent != nullptr) {
        uint64_t groupId = generateGroupId(parent->node.getId(), index);
        node.setId(groupId);
        node.setScopeId(parent->node.getId());
        getSchema().initGroup().setTypeId(groupId);

        sourceInfo.setId(groupId);
        KJ_IF_MAYBE(dc, docComment) {
          sourceInfo.setDocComment(*dc);
        }
      }
    }